

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<WadStuff,_WadStuff>::DoDelete(TArray<WadStuff,_WadStuff> *this,uint first,uint last)

{
  WadStuff *pWVar1;
  int iVar2;
  long lVar3;
  
  if (last != 0xffffffff) {
    if (first <= last) {
      lVar3 = (ulong)first * 0x18;
      iVar2 = (last - first) + 1;
      do {
        pWVar1 = this->Array;
        FString::~FString((FString *)((long)&(pWVar1->Name).Chars + lVar3));
        FString::~FString((FString *)((long)&(pWVar1->Path).Chars + lVar3));
        lVar3 = lVar3 + 0x18;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                ,0x1ad,
                "void TArray<WadStuff>::DoDelete(unsigned int, unsigned int) [T = WadStuff, TT = WadStuff]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}